

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.cpp
# Opt level: O3

void __thiscall
arangodb::velocypack::AttributeTranslator::AttributeTranslator(AttributeTranslator *this)

{
  (this->_builder)._M_t.
  super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
  ._M_t.
  super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
  .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl = (Builder *)0x0;
  (this->_keyToId)._M_h._M_buckets = &(this->_keyToId)._M_h._M_single_bucket;
  (this->_keyToId)._M_h._M_bucket_count = 1;
  (this->_keyToId)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_keyToId)._M_h._M_element_count = 0;
  (this->_keyToId)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_keyToId)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_keyToId)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_idToKey)._M_h._M_buckets = &(this->_idToKey)._M_h._M_single_bucket;
  (this->_idToKey)._M_h._M_bucket_count = 1;
  (this->_idToKey)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_idToKey)._M_h._M_element_count = 0;
  (this->_idToKey)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_idToKey)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_idToKey)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->_count = 0;
  return;
}

Assistant:

AttributeTranslator::AttributeTranslator() : _count(0) {}